

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HullFinder.cpp
# Opt level: O3

void __thiscall OpenMD::HullFinder::~HullFinder(HullFinder *this)

{
  pointer ppSVar1;
  pointer piVar2;
  pointer ppMVar3;
  pointer ppIVar4;
  pointer ppTVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  
  ppSVar1 = (this->localSites_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->localSites_).
                                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->nObjects_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  ppMVar3 = (this->molecules_).
            super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppMVar3 != (pointer)0x0) {
    operator_delete(ppMVar3,(long)(this->molecules_).
                                  super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar3
                   );
  }
  ppIVar4 = (this->inversions_).
            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar4 != (pointer)0x0) {
    operator_delete(ppIVar4,(long)(this->inversions_).
                                  super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar4
                   );
  }
  ppTVar5 = (this->torsions_).
            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar5 != (pointer)0x0) {
    operator_delete(ppTVar5,(long)(this->torsions_).
                                  super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar5
                   );
  }
  ppBVar6 = (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar6 != (pointer)0x0) {
    operator_delete(ppBVar6,(long)(this->bends_).
                                  super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar6
                   );
  }
  ppBVar7 = (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar7 != (pointer)0x0) {
    operator_delete(ppBVar7,(long)(this->bonds_).
                                  super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar7
                   );
  }
  ppSVar1 = (this->stuntdoubles_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->stuntdoubles_).
                                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
    return;
  }
  return;
}

Assistant:

HullFinder::~HullFinder() {
#ifdef HAVE_QHULL
    delete surfaceMesh_;
#endif
  }